

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorTable::Build
          (FieldGeneratorTable *this,Options *options,MessageSCCAnalyzer *scc,
          Span<const_int> has_bit_indices,Span<const_int> inlined_string_indices)

{
  bool bVar1;
  value_type_conflict this_00;
  char *pcVar2;
  reference piVar3;
  uint *puVar4;
  ulong uVar5;
  int __c;
  Iterator *b;
  uint unaff_R12D;
  ulong uVar6;
  size_type i;
  Iterator __begin3;
  Iterator __end3;
  uint local_cc;
  Iterator local_b0;
  Span<const_int> local_a0;
  Iterator local_90;
  FieldGenerator local_80;
  
  local_a0.len_ = has_bit_indices.len_;
  local_a0.ptr_ = has_bit_indices.ptr_;
  std::
  vector<google::protobuf::compiler::cpp::FieldGenerator,_std::allocator<google::protobuf::compiler::cpp::FieldGenerator>_>
  ::reserve(&this->fields_,(long)*(int *)(this->descriptor_ + 4));
  local_b0.descriptor = this->descriptor_;
  local_b0.idx = 0;
  local_90.idx = *(int *)(local_b0.descriptor + 4);
  local_90.descriptor = local_b0.descriptor;
  do {
    b = &local_90;
    bVar1 = protobuf::internal::operator!=(&local_b0,b);
    if (!bVar1) {
      return;
    }
    this_00 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                        (&local_b0);
    pcVar2 = FieldDescriptor::index(this_00,(char *)b,__c);
    i = (size_type)(int)pcVar2;
    if (local_a0.len_ == 0) {
LAB_00175783:
      uVar6 = 0;
    }
    else {
      piVar3 = absl::lts_20240722::Span<const_int>::operator[](&local_a0,i);
      if (*piVar3 < 0) goto LAB_00175783;
      puVar4 = (uint *)absl::lts_20240722::Span<const_int>::operator[](&local_a0,i);
      local_cc = *puVar4;
      uVar6 = 0x100000000;
    }
    if (inlined_string_indices.len_ == 0) {
LAB_001757be:
      uVar5 = 0;
    }
    else {
      piVar3 = absl::lts_20240722::Span<const_int>::operator[](&inlined_string_indices,i);
      if (*piVar3 < 0) goto LAB_001757be;
      puVar4 = (uint *)absl::lts_20240722::Span<const_int>::operator[](&inlined_string_indices,i);
      unaff_R12D = *puVar4;
      uVar5 = 0x100000000;
    }
    FieldGenerator::FieldGenerator
              (&local_80,this_00,options,scc,(optional<unsigned_int>)(uVar6 | local_cc),
               (optional<unsigned_int>)(unaff_R12D | uVar5));
    std::
    vector<google::protobuf::compiler::cpp::FieldGenerator,_std::allocator<google::protobuf::compiler::cpp::FieldGenerator>_>
    ::emplace_back<google::protobuf::compiler::cpp::FieldGenerator>(&this->fields_,&local_80);
    FieldGenerator::~FieldGenerator(&local_80);
    local_b0.idx = local_b0.idx + 1;
  } while( true );
}

Assistant:

void FieldGeneratorTable::Build(
    const Options& options, MessageSCCAnalyzer* scc,
    absl::Span<const int32_t> has_bit_indices,
    absl::Span<const int32_t> inlined_string_indices) {
  // Construct all the FieldGenerators.
  fields_.reserve(static_cast<size_t>(descriptor_->field_count()));
  for (const auto* field : internal::FieldRange(descriptor_)) {
    size_t index = static_cast<size_t>(field->index());
    absl::optional<uint32_t> has_bit_index;
    if (!has_bit_indices.empty() && has_bit_indices[index] >= 0) {
      has_bit_index = static_cast<uint32_t>(has_bit_indices[index]);
    }

    absl::optional<uint32_t> inlined_string_index;
    if (!inlined_string_indices.empty() && inlined_string_indices[index] >= 0) {
      inlined_string_index =
          static_cast<uint32_t>(inlined_string_indices[index]);
    }

    fields_.push_back(FieldGenerator(field, options, scc, has_bit_index,
                                     inlined_string_index));
  }
}